

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall
caffe::HDF5DataParameter::InternalSwap(HDF5DataParameter *this,HDF5DataParameter *other)

{
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  string *psVar4;
  void *pvVar5;
  UnknownFieldSet *other_00;
  
  psVar4 = (this->source_).ptr_;
  (this->source_).ptr_ = (other->source_).ptr_;
  (other->source_).ptr_ = psVar4;
  uVar2 = this->batch_size_;
  this->batch_size_ = other->batch_size_;
  other->batch_size_ = uVar2;
  bVar1 = this->shuffle_;
  this->shuffle_ = other->shuffle_;
  other->shuffle_ = bVar1;
  uVar2 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar2;
  pvVar5 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    if (((ulong)pvVar5 & 1) == 0) goto LAB_004a071d;
LAB_004a0710:
    other_00 = (UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar5 & 1) != 0) goto LAB_004a0710;
    other_00 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(other->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  google::protobuf::internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,other_00)
  ;
LAB_004a071d:
  iVar3 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar3;
  return;
}

Assistant:

void HDF5DataParameter::InternalSwap(HDF5DataParameter* other) {
  source_.Swap(&other->source_);
  std::swap(batch_size_, other->batch_size_);
  std::swap(shuffle_, other->shuffle_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}